

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configreader.cpp
# Opt level: O3

bool __thiscall ConfigReader::parseFiller(ConfigReader *this)

{
  token_t tVar1;
  bool bVar2;
  string fillerName;
  string tokstr;
  string local_88;
  string local_68;
  string local_48;
  
  local_48._M_string_length = 0;
  local_48.field_2._M_local_buf[0] = '\0';
  local_68._M_string_length = 0;
  local_68.field_2._M_local_buf[0] = '\0';
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  tVar1 = tokenize(this,&local_68);
  if (tVar1 == TOK_IDENT) {
    tVar1 = tokenize(this,&local_48);
    if (tVar1 == TOK_SEMICOL) {
      bVar2 = true;
      (*this->_vptr_ConfigReader[6])(this,&local_68);
      goto LAB_0012a18d;
    }
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"Expected ;\n","");
    error(this,&local_88);
  }
  else {
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_88,"Expected a filler cell prefix\n","");
    error(this,&local_88);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  bVar2 = false;
LAB_0012a18d:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,
                    CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,
                             local_68.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,
                    CONCAT71(local_48.field_2._M_allocated_capacity._1_7_,
                             local_48.field_2._M_local_buf[0]) + 1);
  }
  return bVar2;
}

Assistant:

bool ConfigReader::parseFiller()
{
    // FILLER: fillername
    std::string tokstr;
    std::string fillerName;

    // fillername
    ConfigReader::token_t tok = tokenize(fillerName);
    if (tok != TOK_IDENT)
    {
        error("Expected a filler cell prefix\n");
        return false;
    }

    // expect semicol
    tok = tokenize(tokstr);
    if (tok != TOK_SEMICOL)
    {
        error("Expected ;\n");
        return false;
    }

    onFiller(fillerName);
    return true;
}